

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O0

void duckdb::ApproxTopKOperation::Destroy<duckdb::ApproxTopKState>
               (ApproxTopKState *state,AggregateInputData *aggr_input_data)

{
  void *pvVar1;
  InternalApproxTopKState *in_RSI;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    InternalApproxTopKState::~InternalApproxTopKState(in_RSI);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		delete state.state;
	}